

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.h
# Opt level: O3

string * __thiscall bandit::colorizer::light::good_abi_cxx11_(light *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x3b315b1b;
  *(undefined4 *)((long)&in_RDI->field_2 + 3) = 0x6d32333b;
  in_RDI->_M_string_length = 7;
  (in_RDI->field_2)._M_local_buf[7] = '\0';
  return in_RDI;
}

Assistant:

const std::string good() const override {
        return green();
      }